

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O1

void CheckConstraintViolation(string *result_str)

{
  long lVar1;
  AssertionHandler catchAssertionHandler;
  ReusableStringStream local_a8;
  string local_88;
  AssertionHandler local_68;
  StringRef local_20;
  
  lVar1 = std::__cxx11::string::find((char *)result_str,0x4f2a65,0);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char *)result_str,0x4f2a6c,0);
    if (lVar1 == -1) {
      local_88._M_dataplus._M_p = "FAIL";
      local_88._M_string_length = 4;
      local_a8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x4f1b52;
      local_a8.m_index = 0x1b;
      Catch::AssertionHandler::AssertionHandler
                (&local_68,(StringRef *)&local_88,(SourceLineInfo *)&local_a8,
                 (StringRef)ZEXT816(0x504515),Normal);
      local_a8.super_NonCopyable._vptr_NonCopyable = (_func_int **)0x0;
      local_a8.m_index = 0;
      local_a8.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a8.m_oss,(result_str->_M_dataplus)._M_p,
                 result_str->_M_string_length);
      Catch::ReusableStringStream::str_abi_cxx11_(&local_88,&local_a8);
      local_20.m_start = local_88._M_dataplus._M_p;
      local_20.m_size = local_88._M_string_length;
      Catch::AssertionHandler::handleMessage(&local_68,ExplicitFailure,&local_20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      Catch::ReusableStringStream::~ReusableStringStream(&local_a8);
      Catch::AssertionHandler::complete(&local_68);
      if (local_68.m_completed == false) {
        (*(local_68.m_resultCapture)->_vptr_IResultCapture[0x11])();
      }
    }
  }
  return;
}

Assistant:

static void CheckConstraintViolation(const string &result_str) {
	auto constraint_violation =
	    result_str.find("violat") != string::npos || result_str.find("Conflict on tuple deletion") != string::npos;
	if (!constraint_violation) {
		FAIL(result_str);
	}
}